

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

void __thiscall QSimplex::clearColumns(QSimplex *this,int first,int last)

{
  int iVar1;
  qreal *pqVar2;
  int j;
  qreal *row;
  int i;
  int last_local;
  int first_local;
  QSimplex *this_local;
  
  for (i = 0; i < this->rows; i = i + 1) {
    pqVar2 = this->matrix;
    iVar1 = this->columns;
    for (j = first; j <= last; j = j + 1) {
      pqVar2[(long)(i * iVar1) + (long)j] = 0.0;
    }
  }
  return;
}

Assistant:

void QSimplex::clearColumns(int first, int last)
{
    for (int i = 0; i < rows; ++i) {
        qreal *row = matrix + i * columns;
        for (int j = first; j <= last; ++j)
            row[j] = 0.0;
    }
}